

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::getShaderGroup
          (shaderCollectionForTextureFormat *this,samplingFunction function,
          shaderGroup *shader_group)

{
  pointer psVar1;
  pointer psVar2;
  shaderDefinition *psVar3;
  shaderDefinition *psVar4;
  
  shader_group->sampling_tesselation_evaluation_shader = (shaderDefinition *)0x0;
  shader_group->sampling_vertex_shader = (shaderDefinition *)0x0;
  shader_group->sampling_geometry_shader = (shaderDefinition *)0x0;
  shader_group->sampling_tesselation_control_shader = (shaderDefinition *)0x0;
  shader_group->sampling_compute_shader = (shaderDefinition *)0x0;
  shader_group->sampling_fragment_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_tesselation_evaluation_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_vertex_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_fragment_shader = (shaderDefinition *)0x0;
  shader_group->pass_through_tesselation_control_shader = (shaderDefinition *)0x0;
  psVar1 = (this->per_sampling_routine).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->per_sampling_routine).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    psVar4 = &psVar1->sampling_geometry_shader;
    do {
      if (*(samplingFunction *)&psVar4[4].m_gl == function) {
        shader_group->pass_through_fragment_shader = &this->pass_through_fragment_shader;
        shader_group->pass_through_tesselation_control_shader = psVar4 + -3;
        shader_group->pass_through_tesselation_evaluation_shader =
             &this->pass_through_tesselation_evaluation_shader;
        shader_group->pass_through_vertex_shader = psVar4 + -4;
        shader_group->sampling_compute_shader = psVar4 + -2;
        shader_group->sampling_fragment_shader = psVar4 + -1;
        shader_group->sampling_geometry_shader = psVar4;
        shader_group->sampling_tesselation_control_shader = psVar4 + 1;
        shader_group->sampling_tesselation_evaluation_shader = psVar4 + 2;
        shader_group->sampling_vertex_shader = psVar4 + 3;
        return;
      }
      psVar3 = psVar4 + 4;
      psVar4 = (shaderDefinition *)&psVar4[8].m_shader_stage;
    } while ((pointer)&psVar3->m_shader_stage != psVar2);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderGroup::init()
{
	pass_through_fragment_shader			   = 0;
	pass_through_tesselation_control_shader	= 0;
	pass_through_tesselation_evaluation_shader = 0;
	pass_through_vertex_shader				   = 0;
	sampling_compute_shader					   = 0;
	sampling_fragment_shader				   = 0;
	sampling_geometry_shader				   = 0;
	sampling_tesselation_control_shader		   = 0;
	sampling_tesselation_evaluation_shader	 = 0;
	sampling_vertex_shader					   = 0;
}